

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<int>::DeleteNode(BpTree<int> *this,IndexNode<int> *Node)

{
  bool bVar1;
  int iVar2;
  string local_2060 [32];
  undefined1 local_2040 [8];
  Block B;
  IndexNode<int> *Node_local;
  BpTree<int> *this_local;
  
  B._8224_8_ = Node;
  std::vector<int,_std::allocator<int>_>::push_back(&this->FileOff_bin,&(Node->self).FileOff);
  Block::Block((Block *)local_2040,blocks.buffer + *(int *)(B._8224_8_ + 0x58));
  if ((*(int *)(B._8224_8_ + 0x5c) != B._24_4_) ||
     (bVar1 = std::operator!=(&this->Index_FileName,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2040), bVar1)) {
    std::__cxx11::string::string(local_2060,(string *)&this->Index_FileName);
    iVar2 = Buffer::Allocate(&blocks,(string *)local_2060,*(int *)(B._8224_8_ + 0x5c));
    *(int *)(B._8224_8_ + 0x58) = iVar2;
    std::__cxx11::string::~string(local_2060);
  }
  Buffer::Free(&blocks,*(int *)(B._8224_8_ + 0x58));
  Block::~Block((Block *)local_2040);
  return;
}

Assistant:

void BpTree<K>::DeleteNode(IndexNode<K> &Node) {
	this->FileOff_bin.push_back(Node.self.FileOff);
	Block B = blocks.buffer[Node.self.BlockNum];
	if (Node.self.FileOff != B.FileOff || this->Index_FileName != B.FileName) {
		//�����һ���Ѿ�������ռ�죬��Ҫ����µ�һ��
		Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);
	}
	blocks.Free(Node.self.BlockNum);
}